

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O0

int mbedtls_pk_debug(mbedtls_pk_context *ctx,mbedtls_pk_debug_item *items)

{
  mbedtls_pk_debug_item *items_local;
  mbedtls_pk_context *ctx_local;
  
  if (ctx->pk_info == (mbedtls_pk_info_t *)0x0) {
    ctx_local._4_4_ = -16000;
  }
  else if (ctx->pk_info->debug_func == (_func_void_void_ptr_mbedtls_pk_debug_item_ptr *)0x0) {
    ctx_local._4_4_ = -0x3f00;
  }
  else {
    (*ctx->pk_info->debug_func)(ctx->pk_ctx,items);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_pk_debug( const mbedtls_pk_context *ctx, mbedtls_pk_debug_item *items )
{
    PK_VALIDATE_RET( ctx != NULL );
    if( ctx->pk_info == NULL )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    if( ctx->pk_info->debug_func == NULL )
        return( MBEDTLS_ERR_PK_TYPE_MISMATCH );

    ctx->pk_info->debug_func( ctx->pk_ctx, items );
    return( 0 );
}